

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandDSat(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  Abc_Ntk_t *pAVar2;
  int iVar3;
  uint fNewSolver;
  uint fAndOuts;
  uint uVar4;
  uint fShowPattern;
  uint fVerbose;
  uint fAlignPol;
  int iVar5;
  FILE *__stream;
  int *piVar6;
  Abc_Cex_t *pAVar7;
  abctime aVar8;
  abctime aVar9;
  char *pcVar10;
  abctime time;
  char *pcVar11;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  int *local_40;
  Abc_Ntk_t *local_38;
  
  local_38 = Abc_FrameReadNtk(pAbc);
  fNewSolver = 0;
  Extra_UtilGetoptReset();
  bVar1 = false;
  fShowPattern = 0;
  fVerbose = 0;
  local_88 = 0;
  local_84 = 0;
  local_80 = 0;
  local_7c = 0;
  local_78 = 0;
  fAndOuts = 0;
  fAlignPol = 0;
  do {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"CILDEpansvwh"), pAVar2 = local_38,
          iVar5 = globalUtilOptind, 0x60 < iVar3) {
      switch(iVar3) {
      case 0x6e:
        fNewSolver = fNewSolver ^ 1;
        break;
      case 0x6f:
      case 0x71:
      case 0x72:
      case 0x74:
      case 0x75:
        goto switchD_0026d488_caseD_6f;
      case 0x70:
        fAlignPol = fAlignPol ^ 1;
        break;
      case 0x73:
        bVar1 = (bool)(bVar1 ^ 1);
        break;
      case 0x76:
        fVerbose = fVerbose ^ 1;
        break;
      case 0x77:
        fShowPattern = fShowPattern ^ 1;
        break;
      default:
        if (iVar3 != 0x61) goto switchD_0026d488_caseD_6f;
        fAndOuts = fAndOuts ^ 1;
      }
    }
    switch(iVar3) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        pcVar10 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0026d650:
        Abc_Print(-1,pcVar10);
        goto switchD_0026d488_caseD_6f;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      local_88 = uVar4;
      break;
    case 0x44:
      if (argc <= globalUtilOptind) {
        pcVar10 = "Command line switch \"-D\" should be followed by an integer.\n";
        goto LAB_0026d650;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      local_80 = uVar4;
      break;
    case 0x45:
      if (argc <= globalUtilOptind) {
        pcVar10 = "Command line switch \"-E\" should be followed by an integer.\n";
        goto LAB_0026d650;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      local_7c = uVar4;
      break;
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x4a:
    case 0x4b:
      goto switchD_0026d488_caseD_6f;
    case 0x49:
      if (argc <= globalUtilOptind) {
        pcVar10 = "Command line switch \"-I\" should be followed by an integer.\n";
        goto LAB_0026d650;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      local_78 = uVar4;
      break;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        pcVar10 = "Command line switch \"-L\" should be followed by an integer.\n";
        goto LAB_0026d650;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      local_84 = uVar4;
      break;
    default:
      if (iVar3 == -1) {
        if (globalUtilOptind + 1 == argc) {
          local_40 = (int *)0x0;
          pcVar10 = argv[globalUtilOptind];
          __stream = fopen(pcVar10,"rb");
          pAVar2 = local_38;
          if (__stream == (FILE *)0x0) {
            printf("Cannot open file \"%s\" for writing.\n",pcVar10);
          }
          else {
            fclose(__stream);
            if (pAVar2 == (Abc_Ntk_t *)0x0) {
              iVar5 = 0;
            }
            else {
              iVar5 = pAVar2->vPis->nSize;
            }
            Cnf_DataSolveFromFile
                      (pcVar10,local_88,local_84,local_80,local_7c,fVerbose,fShowPattern,&local_40,
                       iVar5);
            if (local_40 != (int *)0x0 && pAVar2 != (Abc_Ntk_t *)0x0) {
              piVar6 = Abc_NtkVerifySimulatePattern(pAVar2,local_40);
              if (*piVar6 != 1) {
                Abc_Print(1,"ERROR in mapping PIs into SAT vars: Generated CEX is invalid.\n");
              }
              free(piVar6);
              pAVar7 = Abc_CexCreate(0,pAVar2->vPis->nSize,local_40,0,0,0);
              pAbc->pCex = pAVar7;
            }
            if (local_40 != (int *)0x0) {
              free(local_40);
            }
          }
          return 0;
        }
        if (local_38 != (Abc_Ntk_t *)0x0) {
          if (local_38->nObjCounts[8] < 1) {
            if (local_38->vPos->nSize == 1) {
              if (local_38->ntkType == ABC_NTK_STRASH) {
                aVar8 = Abc_Clock();
                iVar5 = Abc_NtkDSat(pAVar2,(ulong)local_88,(ulong)local_78,local_84,local_80,
                                    local_7c,fAlignPol,fAndOuts,fNewSolver,fVerbose);
                if ((iVar5 == 0) && (pAVar2->vPos->nSize == 1)) {
                  piVar6 = Abc_NtkVerifySimulatePattern(pAVar2,pAVar2->pModel);
                  if (*piVar6 != 1) {
                    Abc_Print(1,
                              "ERROR in Abc_NtkMiterSat(): Generated counter example is invalid.\n")
                    ;
                  }
                  free(piVar6);
                  pAVar7 = Abc_CexCreate(0,pAVar2->vPis->nSize,pAVar2->pModel,0,0,0);
                  pAbc->pCex = pAVar7;
                }
                pAbc->Status = iVar5;
                if (bVar1) {
                  return 0;
                }
                pcVar10 = "UNSATISFIABLE  ";
                if (iVar5 == 0) {
                  pcVar10 = "SATISFIABLE    ";
                }
                pcVar11 = "UNDECIDED      ";
                if (iVar5 != -1) {
                  pcVar11 = pcVar10;
                }
                Abc_Print(1,pcVar11);
                aVar9 = Abc_Clock();
                Abc_PrintTime((int)aVar9 - (int)aVar8,pcVar11,time);
                return 0;
              }
              pcVar10 = "Currently only works for structurally hashed circuits.\n";
            }
            else {
              pcVar10 = "Currently expects a single-output miter.\n";
            }
          }
          else {
            pcVar10 = "Currently can only solve the miter for combinational circuits.\n";
          }
          Abc_Print(-1,pcVar10);
          return 0;
        }
        pcVar10 = "Empty network.\n";
        iVar5 = -1;
        goto LAB_0026d7c7;
      }
      goto switchD_0026d488_caseD_6f;
    }
    globalUtilOptind = iVar5 + 1;
  } while (-1 < (int)uVar4);
switchD_0026d488_caseD_6f:
  Abc_Print(-2,"usage: dsat [-CILDE num] [-pansvh]\n");
  Abc_Print(-2,"\t         solves the combinational miter using SAT solver MiniSat-1.14\n");
  Abc_Print(-2,"\t         derives CNF from the current network and leaves it unchanged\n");
  Abc_Print(-2,"\t-C num : limit on the number of conflicts [default = %d]\n",(ulong)local_88);
  Abc_Print(-2,"\t-I num : limit on the number of inspections [default = %d]\n",(ulong)local_78);
  Abc_Print(-2,"\t-L num : starting value for learned clause removal [default = %d]\n",
            (ulong)local_84);
  Abc_Print(-2,"\t-D num : delta value for learned clause removal [default = %d]\n",(ulong)local_80)
  ;
  Abc_Print(-2,"\t-E num : ratio percentage for learned clause removal [default = %d]\n",
            (ulong)local_7c);
  pcVar11 = "yes";
  pcVar10 = "yes";
  if (fAlignPol == 0) {
    pcVar10 = "no";
  }
  Abc_Print(-2,"\t-p     : align polarity of SAT variables [default = %s]\n",pcVar10);
  pcVar10 = "ANDing";
  if (fAndOuts == 0) {
    pcVar10 = "ORing";
  }
  Abc_Print(-2,"\t-a     : toggle ANDing/ORing of miter outputs [default = %s]\n",pcVar10);
  pcVar10 = "yes";
  if (fNewSolver == 0) {
    pcVar10 = "no";
  }
  Abc_Print(-2,"\t-n     : toggle using new solver [default = %s]\n",pcVar10);
  pcVar10 = "yes";
  if (!bVar1) {
    pcVar10 = "no";
  }
  Abc_Print(-2,"\t-s     : enable silent computation (no reporting) [default = %s]\n",pcVar10);
  if (fVerbose == 0) {
    pcVar11 = "no";
  }
  Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar11);
  pcVar10 = "\t-h     : print the command usage\n";
  iVar5 = -2;
LAB_0026d7c7:
  Abc_Print(iVar5,pcVar10);
  return 1;
}

Assistant:

int Abc_CommandDSat( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int RetValue;
    int fAlignPol;
    int fAndOuts;
    int fNewSolver;
    int fSilent;
    int fShowPattern;
    int fVerbose;
    int nConfLimit;
    int nLearnedStart;
    int nLearnedDelta;
    int nLearnedPerce;
    int nInsLimit;
    abctime clk;

    extern int Abc_NtkDSat( Abc_Ntk_t * pNtk, ABC_INT64_T nConfLimit, ABC_INT64_T nInsLimit, int nLearnedStart, int nLearnedDelta, int nLearnedPerce, int fAlignPol, int fAndOuts, int fNewSolver, int fVerbose );
    // set defaults
    fAlignPol  = 0;
    fAndOuts   = 0;
    fNewSolver = 0;
    fSilent    = 0;
    fShowPattern = 0;
    fVerbose   = 0;
    nConfLimit = 0;
    nInsLimit  = 0;
    nLearnedStart = 0;
    nLearnedDelta = 0;
    nLearnedPerce = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CILDEpansvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfLimit < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nInsLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nInsLimit < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLearnedStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLearnedStart < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            nLearnedDelta = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLearnedDelta < 0 )
                goto usage;
            break;
        case 'E':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-E\" should be followed by an integer.\n" );
                goto usage;
            }
            nLearnedPerce = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLearnedPerce < 0 )
                goto usage;
            break;
        case 'p':
            fAlignPol ^= 1;
            break;
        case 'a':
            fAndOuts ^= 1;
            break;
        case 'n':
            fNewSolver ^= 1;
            break;
        case 's':
            fSilent ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fShowPattern ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( argc == globalUtilOptind + 1 )
    {
        int * pModel = NULL;
        extern int Cnf_DataSolveFromFile( char * pFileName, int nConfLimit, int nLearnedStart, int nLearnedDelta, int nLearnedPerce, int fVerbose, int fShowPattern, int ** ppModel, int nPis );
        // get the input file name
        char * pFileName = argv[globalUtilOptind];
        FILE * pFile = fopen( pFileName, "rb" );
        if ( pFile == NULL )
        {
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
            return 0;
        }
        fclose( pFile );
        Cnf_DataSolveFromFile( pFileName, nConfLimit, nLearnedStart, nLearnedDelta, nLearnedPerce, fVerbose, fShowPattern, &pModel, pNtk ? Abc_NtkPiNum(pNtk) : 0 );
        if ( pModel && pNtk )
        {
            int * pSimInfo = Abc_NtkVerifySimulatePattern( pNtk, pModel );
            if ( pSimInfo[0] != 1 )
                Abc_Print( 1, "ERROR in mapping PIs into SAT vars: Generated CEX is invalid.\n" );
            ABC_FREE( pSimInfo );
            pAbc->pCex = Abc_CexCreate( 0, Abc_NtkPiNum(pNtk), pModel, 0, 0, 0 );
        }
        ABC_FREE( pModel );
        return 0;
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkLatchNum(pNtk) > 0 )
    {
        Abc_Print( -1, "Currently can only solve the miter for combinational circuits.\n" );
        return 0;
    }

    if ( Abc_NtkPoNum(pNtk) != 1 )
    {
        Abc_Print( -1, "Currently expects a single-output miter.\n" );
        return 0;
    }

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Currently only works for structurally hashed circuits.\n" );
        return 0;
    }
    clk = Abc_Clock();
    RetValue = Abc_NtkDSat( pNtk, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)nInsLimit, nLearnedStart, nLearnedDelta, nLearnedPerce, fAlignPol, fAndOuts, fNewSolver, fVerbose );
    // verify that the pattern is correct
    if ( RetValue == 0 && Abc_NtkPoNum(pNtk) == 1 )
    {
        int * pSimInfo = Abc_NtkVerifySimulatePattern( pNtk, pNtk->pModel );
        if ( pSimInfo[0] != 1 )
            Abc_Print( 1, "ERROR in Abc_NtkMiterSat(): Generated counter example is invalid.\n" );
        ABC_FREE( pSimInfo );
        pAbc->pCex = Abc_CexCreate( 0, Abc_NtkPiNum(pNtk), pNtk->pModel, 0, 0, 0 );
    }
    pAbc->Status = RetValue;
    if ( !fSilent )
    {
        if ( RetValue == -1 )
            Abc_Print( 1, "UNDECIDED      " );
        else if ( RetValue == 0 )
            Abc_Print( 1, "SATISFIABLE    " );
        else
            Abc_Print( 1, "UNSATISFIABLE  " );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: dsat [-CILDE num] [-pansvh]\n" );
    Abc_Print( -2, "\t         solves the combinational miter using SAT solver MiniSat-1.14\n" );
    Abc_Print( -2, "\t         derives CNF from the current network and leaves it unchanged\n" );
    Abc_Print( -2, "\t-C num : limit on the number of conflicts [default = %d]\n",    nConfLimit );
    Abc_Print( -2, "\t-I num : limit on the number of inspections [default = %d]\n", nInsLimit );
    Abc_Print( -2, "\t-L num : starting value for learned clause removal [default = %d]\n", nLearnedStart );
    Abc_Print( -2, "\t-D num : delta value for learned clause removal [default = %d]\n", nLearnedDelta );
    Abc_Print( -2, "\t-E num : ratio percentage for learned clause removal [default = %d]\n", nLearnedPerce );
    Abc_Print( -2, "\t-p     : align polarity of SAT variables [default = %s]\n", fAlignPol? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle ANDing/ORing of miter outputs [default = %s]\n", fAndOuts? "ANDing": "ORing" );
    Abc_Print( -2, "\t-n     : toggle using new solver [default = %s]\n", fNewSolver? "yes": "no" );
    Abc_Print( -2, "\t-s     : enable silent computation (no reporting) [default = %s]\n", fSilent? "yes": "no" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}